

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

bool slang::ast::anon_unknown_39::isInProgram(Symbol *symbol)

{
  while( true ) {
    if (symbol->kind == AnonymousProgram) {
      return true;
    }
    if (symbol->kind == InstanceBody) break;
    if (symbol->parentScope == (Scope *)0x0) {
      return false;
    }
    symbol = symbol->parentScope->thisSym;
  }
  return *(int *)(symbol[2].name._M_str + 0x48) == 2;
}

Assistant:

bool isInProgram(const Symbol& symbol) {
    auto curr = &symbol;
    while (true) {
        if (curr->kind == SymbolKind::AnonymousProgram)
            return true;

        if (curr->kind == SymbolKind::InstanceBody) {
            return curr->as<InstanceBodySymbol>().getDefinition().definitionKind ==
                   DefinitionKind::Program;
        }

        auto scope = curr->getParentScope();
        if (!scope)
            return false;

        curr = &scope->asSymbol();
    }
}